

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

void pzshape::TPZShapePrism::TransformDerivativeFromFaceToPrisma
               (int face,int num,TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  int in_ESI;
  int in_EDI;
  double dVar5;
  REAL dphi1j;
  int j;
  double in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  TPZFMatrix<double> *in_stack_ffffffffffffffb0;
  int local_14;
  
  for (local_14 = 0; local_14 < in_ESI; local_14 = local_14 + 1) {
    dVar1 = *(double *)(gFaceTrans3dPrisma2d + (long)in_EDI * 0x30 + 0x10);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 = *pdVar4;
    dVar2 = *(double *)(gFaceTrans3dPrisma2d + (long)in_EDI * 0x30 + 0x28);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa8 = dVar1 * in_stack_ffffffffffffffa0 + dVar2 * *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    *pdVar4 = in_stack_ffffffffffffffa8;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    dVar1 = *pdVar4;
    dVar2 = *(double *)(gFaceTrans3dPrisma2d + (long)in_EDI * 0x30 + 8);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    dVar3 = *pdVar4;
    in_stack_ffffffffffffffb0 =
         *(TPZFMatrix<double> **)(gFaceTrans3dPrisma2d + (long)in_EDI * 0x30 + 0x20);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    dVar5 = (double)in_stack_ffffffffffffffb0 * *pdVar4;
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    *pdVar4 = dVar2 * dVar3 + dVar5;
    dVar2 = *(double *)(gFaceTrans3dPrisma2d + (long)in_EDI * 0x30);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    dVar3 = *pdVar4;
    dVar5 = *(double *)(gFaceTrans3dPrisma2d + (long)in_EDI * 0x30 + 0x18);
    pdVar4 = TPZFMatrix<double>::operator()
                       (in_stack_ffffffffffffffb0,(int64_t)in_stack_ffffffffffffffa8,
                        (int64_t)in_stack_ffffffffffffffa0);
    *pdVar4 = dVar2 * dVar3 + dVar5 * dVar1;
  }
  return;
}

Assistant:

void TPZShapePrism::TransformDerivativeFromFaceToPrisma(int face,int num,TPZFMatrix<REAL> &dphi) {
		for (int j = 0;j<num;j++) {
			dphi(2,j) = gFaceTrans3dPrisma2d[face][0][2]*dphi(0,j)+gFaceTrans3dPrisma2d[face][1][2]*dphi(1,j);
			REAL dphi1j = dphi(1,j);
			dphi(1,j) = gFaceTrans3dPrisma2d[face][0][1]*dphi(0,j)+gFaceTrans3dPrisma2d[face][1][1]*dphi(1,j);
			dphi(0,j) = gFaceTrans3dPrisma2d[face][0][0]*dphi(0,j)+gFaceTrans3dPrisma2d[face][1][0]*dphi1j;//dphi(1,j);
		}
	}